

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  QStyleSheetPaletteData *pQVar4;
  QStyleSheetBoxData *pQVar5;
  QStyleSheetBackgroundData *pQVar6;
  QStyleSheetBorderData *pQVar7;
  QStyleSheetOutlineData *pQVar8;
  QStyleSheetGeometryData *pQVar9;
  QStyleSheetPositionData *pQVar10;
  QStyleSheetImageData *pQVar11;
  qsizetype qVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ButtonInfo *pBVar17;
  long lVar18;
  ButtonInfo *pBVar19;
  Int IVar20;
  long lVar21;
  ButtonInfo *pBVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  QArrayData *d;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar13 = true;
    }
    else {
      bVar13 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar13)) {
      if (pQVar2 == (QArrayData *)0x0) {
        lVar18 = 1;
        lVar21 = 0;
      }
      else {
        lVar18 = pQVar2->alloc + 1;
        lVar21 = (this->size - pQVar2->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                 -0x79435e50d79435e5;
      }
      auVar23 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x98,lVar18 + lVar21,Grow);
      this->d = (Data *)auVar23._0_8_;
      this->ptr = (ButtonInfo *)auVar23._8_8_;
      goto LAB_0036f5b1;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (ButtonInfo *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    lVar18 = 0;
  }
  else {
    lVar18 = (pDVar1->super_QArrayData).alloc;
  }
  lVar21 = this->size;
  if (lVar18 < lVar21) {
    lVar18 = lVar21;
  }
  if (where == GrowsAtEnd) {
    if (pDVar1 == (Data *)0x0) goto LAB_0036f2a7;
    lVar21 = (lVar21 - (pDVar1->super_QArrayData).alloc) +
             ((long)((long)this->ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             3) * -0x79435e50d79435e5;
  }
  else if (pDVar1 == (Data *)0x0) {
LAB_0036f2a7:
    lVar21 = 0;
  }
  else {
    lVar21 = ((long)((long)this->ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             3) * 0x79435e50d79435e5;
  }
  lVar21 = lVar18 + n + lVar21;
  if (pDVar1 != (Data *)0x0) {
    lVar18 = (pDVar1->super_QArrayData).alloc;
    if (lVar18 <= lVar21) {
      lVar18 = lVar21;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar21 = lVar18;
    }
  }
  if (pDVar1 == (Data *)0x0) {
    lVar18 = 0;
  }
  else {
    lVar18 = (pDVar1->super_QArrayData).alloc;
  }
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pBVar17 = (ButtonInfo *)QArrayData::allocate(&local_40,0x98,0x10,lVar21,(uint)(lVar21 <= lVar18));
  if (pBVar17 != (ButtonInfo *)0x0 && local_40 != (QArrayData *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar21 = (local_40->alloc - (this->size + n)) / 2;
      lVar18 = 0;
      if (0 < lVar21) {
        lVar18 = lVar21;
      }
      lVar18 = lVar18 + n;
    }
    else if (this->d == (Data *)0x0) {
      lVar18 = 0;
    }
    else {
      lVar18 = ((long)((long)this->ptr -
                      ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * -0x79435e50d79435e5;
    }
    if (this->d == (Data *)0x0) {
      IVar20 = 0;
    }
    else {
      IVar20 = (this->d->super_QArrayData).flags.
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pBVar17 = pBVar17 + lVar18;
    (local_40->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar20;
  }
  local_58.d = (Data *)local_40;
  local_58.size = 0;
  lVar18 = this->size;
  local_58.ptr = pBVar17;
  lVar21 = local_58.size;
  if (lVar18 != 0) {
    if ((this->d == (Data *)0x0) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      if (0 < lVar18) {
        pBVar22 = this->ptr;
        pBVar19 = pBVar22 + lVar18;
        lVar21 = 0;
        do {
          QRenderRule::QRenderRule(&pBVar17->rule,&pBVar22->rule);
          iVar14 = pBVar22->offset;
          iVar15 = pBVar22->where;
          iVar16 = pBVar22->width;
          pBVar17->element = pBVar22->element;
          pBVar17->offset = iVar14;
          pBVar17->where = iVar15;
          pBVar17->width = iVar16;
          pBVar22 = pBVar22 + 1;
          lVar21 = lVar21 + 1;
          pBVar17 = pBVar17 + 1;
        } while (pBVar22 < pBVar19);
      }
    }
    else if (0 < lVar18) {
      pBVar22 = this->ptr;
      pBVar19 = pBVar22 + lVar18;
      do {
        qVar12 = local_58.size;
        pBVar17[local_58.size].rule.features = (pBVar22->rule).features;
        QBrush::QBrush(&pBVar17[local_58.size].rule.defaultBackground,
                       &(pBVar22->rule).defaultBackground);
        QFont::QFont(&pBVar17[qVar12].rule.font,&(pBVar22->rule).font);
        pBVar17[qVar12].rule.hasFont = (pBVar22->rule).hasFont;
        pDVar3 = (pBVar22->rule).styleHints.d;
        (pBVar22->rule).styleHints.d = (Data *)0x0;
        pBVar17[qVar12].rule.styleHints.d = pDVar3;
        pQVar4 = (pBVar22->rule).pal.d.ptr;
        (pBVar22->rule).pal.d.ptr = (QStyleSheetPaletteData *)0x0;
        pBVar17[qVar12].rule.pal.d.ptr = pQVar4;
        pQVar5 = (pBVar22->rule).b.d.ptr;
        (pBVar22->rule).b.d.ptr = (QStyleSheetBoxData *)0x0;
        pBVar17[qVar12].rule.b.d.ptr = pQVar5;
        pQVar6 = (pBVar22->rule).bg.d.ptr;
        (pBVar22->rule).bg.d.ptr = (QStyleSheetBackgroundData *)0x0;
        pBVar17[qVar12].rule.bg.d.ptr = pQVar6;
        pQVar7 = (pBVar22->rule).bd.d.ptr;
        (pBVar22->rule).bd.d.ptr = (QStyleSheetBorderData *)0x0;
        pBVar17[qVar12].rule.bd.d.ptr = pQVar7;
        pQVar8 = (pBVar22->rule).ou.d.ptr;
        (pBVar22->rule).ou.d.ptr = (QStyleSheetOutlineData *)0x0;
        pBVar17[qVar12].rule.ou.d.ptr = pQVar8;
        pQVar9 = (pBVar22->rule).geo.d.ptr;
        (pBVar22->rule).geo.d.ptr = (QStyleSheetGeometryData *)0x0;
        pBVar17[qVar12].rule.geo.d.ptr = pQVar9;
        pQVar10 = (pBVar22->rule).p.d.ptr;
        (pBVar22->rule).p.d.ptr = (QStyleSheetPositionData *)0x0;
        pBVar17[qVar12].rule.p.d.ptr = pQVar10;
        pQVar11 = (pBVar22->rule).img.d.ptr;
        (pBVar22->rule).img.d.ptr = (QStyleSheetImageData *)0x0;
        pBVar17[qVar12].rule.img.d.ptr = pQVar11;
        pQVar11 = (pBVar22->rule).iconPtr.d.ptr;
        (pBVar22->rule).iconPtr.d.ptr = (QStyleSheetImageData *)0x0;
        pBVar17[qVar12].rule.iconPtr.d.ptr = pQVar11;
        pBVar17[qVar12].rule.clipset = (pBVar22->rule).clipset;
        QPainterPath::QPainterPath(&pBVar17[qVar12].rule.clipPath,&(pBVar22->rule).clipPath);
        iVar14 = pBVar22->offset;
        iVar15 = pBVar22->where;
        iVar16 = pBVar22->width;
        pBVar17[qVar12].element = pBVar22->element;
        pBVar17[qVar12].offset = iVar14;
        pBVar17[qVar12].where = iVar15;
        pBVar17[qVar12].width = iVar16;
        local_58.size = local_58.size + 1;
        pBVar22 = pBVar22 + 1;
        lVar21 = local_58.size;
      } while (pBVar22 < pBVar19);
    }
  }
  local_58.size = lVar21;
  pDVar1 = this->d;
  pBVar17 = this->ptr;
  this->d = local_58.d;
  this->ptr = local_58.ptr;
  qVar12 = this->size;
  this->size = local_58.size;
  local_58.d = pDVar1;
  local_58.ptr = pBVar17;
  local_58.size = qVar12;
  ~QArrayDataPointer(&local_58);
LAB_0036f5b1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }